

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar6;
  undefined4 *puVar7;
  PropertyRecord *pPropertyName;
  ScriptContext *scriptContext;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data_local;
  OpCode op_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,data->PropertyIdIndex);
  this_00 = ScriptContext::GetPropertyName(this,propertyId);
  switch(op) {
  case LdSuperFld:
    uVar3 = data->Value;
    uVar1 = data->Instance;
    uVar2 = data->Value2;
    pcVar6 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = R%d(this=R%d).%s #%d",(ulong)uVar3,(ulong)uVar1,(ulong)uVar2,pcVar6,
                  (ulong)data->PropertyIdIndex);
    break;
  case ProfiledLdSuperFld:
    uVar3 = data->Value;
    uVar1 = data->Instance;
    uVar2 = data->Value2;
    pcVar6 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = R%d(this=R%d).%s #%d",(ulong)uVar3,(ulong)uVar1,(ulong)uVar2,pcVar6,
                  (ulong)data->PropertyIdIndex);
    DumpProfileId(data->PropertyIdIndex);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x315,"(false)","Unknown OpCode for OpLayoutElementC2");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    break;
  case StSuperFld:
  case StSuperFldStrict:
    uVar3 = data->Instance;
    pcVar6 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d.%s(this=R%d) = R%d #%d",(ulong)uVar3,pcVar6,(ulong)data->Value2,
                  (ulong)data->Value,(ulong)data->PropertyIdIndex);
    break;
  case ProfiledStSuperFld:
  case ProfiledStSuperFldStrict:
    uVar3 = data->Instance;
    pcVar6 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d.%s(this=R%d) = R%d #%d",(ulong)uVar3,pcVar6,(ulong)data->Value2,
                  (ulong)data->Value,(ulong)data->PropertyIdIndex);
    DumpProfileId(data->PropertyIdIndex);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementC2(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        switch (op)
        {
            case OpCode::LdSuperFld:
            {
                Output::Print(_u(" R%d = R%d(this=R%d).%s #%d"), data->Value, data->Instance, data->Value2,
                        pPropertyName->GetBuffer(), data->PropertyIdIndex);
                break;
            }
            case OpCode::ProfiledLdSuperFld:
            {
                Output::Print(_u(" R%d = R%d(this=R%d).%s #%d"), data->Value, data->Instance, data->Value2,
                        pPropertyName->GetBuffer(), data->PropertyIdIndex);
                DumpProfileId(data->PropertyIdIndex);
                break;
            }
            case OpCode::StSuperFld:
            case OpCode::StSuperFldStrict:
            {
                Output::Print(_u(" R%d.%s(this=R%d) = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                    data->Value2, data->Value, data->PropertyIdIndex);
                break;
            }
            case OpCode::ProfiledStSuperFld:
            case OpCode::ProfiledStSuperFldStrict:
            {
                Output::Print(_u(" R%d.%s(this=R%d) = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                    data->Value2, data->Value, data->PropertyIdIndex);
                DumpProfileId(data->PropertyIdIndex);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementC2");
                break;
            }
        }
    }